

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int fits_calc_binningd(fitsfile *fptr,int naxis,char (*colname) [71],double *minin,double *maxin,
                      double *binsizein,char (*minname) [71],char (*maxname) [71],
                      char (*binname) [71],int *colnum,long *haxes,double *amin,double *amax,
                      double *binsize,int *status)

{
  int iVar1;
  
  iVar1 = fits_calc_binningde(fptr,naxis,colname,(char **)0x0,minin,maxin,binsizein,minname,maxname,
                              binname,colnum,(int *)0x0,haxes,amin,amax,binsize,(long *)0x0,status);
  return iVar1;
}

Assistant:

int fits_calc_binningd(
      fitsfile *fptr,  /* IO - pointer to table to be binned      ;       */
      int naxis,       /* I - number of axes/columns in the binned image  */
      char colname[4][FLEN_VALUE],   /* I - optional column names         */
      double *minin,     /* I - optional lower bound value for each axis  */
      double *maxin,     /* I - optional upper bound value, for each axis */
      double *binsizein, /* I - optional bin size along each axis         */
      char minname[4][FLEN_VALUE], /* I - optional keywords for min       */
      char maxname[4][FLEN_VALUE], /* I - optional keywords for max       */
      char binname[4][FLEN_VALUE], /* I - optional keywords for binsize   */

    /* The returned parameters for each axis of the n-dimensional histogram are */

      int *colnum,     /* O - column numbers, to be binned */
      long *haxes,     /* O - number of bins in each histogram axis */
      double *amin,     /* O - lower bound of the histogram axes */
      double *amax,     /* O - upper bound of the histogram axes */
      double *binsize,  /* O - width of histogram bins/pixels on each axis */
      int *status)
/*
  Calculate the actual binning parameters, non-extended-syntax version
*/
{
  return fits_calc_binningde(fptr, naxis, colname, 0, 
			     minin, maxin, binsizein, 
			     minname, maxname, binname, 
			     colnum, 0, haxes, amin, amax, binsize, 0, 
			     status);
}